

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O1

dis_res * do_dis(decoctx *deco,uint32_t cur)

{
  ulong *puVar1;
  uint uVar2;
  int iVar3;
  uint32_t uVar4;
  int iVar5;
  dis_res *status;
  easm_insn *peVar6;
  easm_subinsn **ppeVar7;
  easm_subinsn *peVar8;
  easm_expr **ppeVar9;
  easm_expr *peVar10;
  easm_sinsn *peVar11;
  insn *v;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  byte bVar15;
  int iVar16;
  bool bVar17;
  disctx c;
  int local_7c;
  disctx local_78;
  long local_48;
  easm_insn *local_40;
  dis_res *local_38;
  
  local_78.atomsnum = 0;
  local_78.atomsmax = 0;
  local_78.endmark = 0;
  local_78._44_4_ = 0;
  local_78.oplen = 0;
  local_78._20_4_ = 0;
  local_78.atoms = (litem **)0x0;
  local_78.isa = (disisa *)0x0;
  local_78.varinfo = (varinfo *)0x0;
  status = (dis_res *)calloc(0x48,1);
  uVar4 = ed_getcbsz(deco->isa,deco->varinfo);
  uVar13 = uVar4 + 7 >> 3;
  uVar2 = deco->codesz;
  bVar15 = 0;
  uVar14 = 0;
  do {
    if (uVar2 <= (int)((uVar14 & 0xffffffff) / (ulong)uVar13) + cur) break;
    puVar1 = (ulong *)((long)status->a + (ulong)((uint)uVar14 & 0xfffffff8));
    *puVar1 = *puVar1 | (ulong)deco->code[uVar13 * cur + (uint)uVar14] << (bVar15 & 0x38);
    uVar14 = uVar14 + 1;
    bVar15 = bVar15 + 8;
  } while (uVar14 != 0x10);
  local_78.isa = deco->isa;
  local_78.varinfo = deco->varinfo;
  v = (local_78.isa)->tsched;
  if ((v == (insn *)0x0) || (cur % (uint)(local_78.isa)->schedpos != 0)) {
    v = (local_78.isa)->troot;
  }
  atomtab_d(&local_78,status->a,status->m,v);
  status->oplen = local_78.oplen;
  if (deco->codesz < cur + local_78.oplen) {
    *(undefined1 *)&status->status = (char)status->status | DIS_STATUS_EOF;
  }
  if (local_78.oplen == 0) {
    *(undefined1 *)&status->status = (char)status->status | DIS_STATUS_UNK_FORM;
    status->oplen = (local_78.isa)->opunit;
  }
  status->endmark = local_78.endmark;
  local_7c = 0;
  peVar6 = (easm_insn *)calloc(0x28,1);
  iVar3 = peVar6->subinsnsnum;
  iVar16 = peVar6->subinsnsmax;
  if (iVar16 <= iVar3) {
    iVar5 = 0x10;
    if (iVar16 != 0) {
      iVar5 = iVar16 * 2;
    }
    peVar6->subinsnsmax = iVar5;
    ppeVar7 = (easm_subinsn **)realloc(peVar6->subinsns,(long)iVar5 << 3);
    peVar6->subinsns = ppeVar7;
  }
  peVar8 = (easm_subinsn *)calloc(0x30,1);
  lVar12 = (long)iVar3;
  if ((*local_78.atoms)->type != LITEM_NAME) {
    lVar12 = (long)peVar8->prefsnum;
    iVar16 = peVar8->prefsmax;
    local_48 = (long)iVar3;
    local_40 = peVar6;
    local_38 = status;
    do {
      if (iVar16 <= lVar12) {
        bVar17 = iVar16 == 0;
        iVar16 = iVar16 * 2;
        if (bVar17) {
          iVar16 = 0x10;
        }
        ppeVar9 = (easm_expr **)realloc(peVar8->prefs,(long)iVar16 << 3);
        peVar8->prefs = ppeVar9;
        status = local_38;
      }
      peVar10 = dis_parse_expr(&local_78,&status->status,&local_7c);
      peVar8->prefs[lVar12] = peVar10;
      lVar12 = lVar12 + 1;
    } while (local_78.atoms[local_7c]->type != LITEM_NAME);
    peVar8->prefsnum = (int)lVar12;
    peVar8->prefsmax = iVar16;
    lVar12 = local_48;
    peVar6 = local_40;
  }
  peVar11 = dis_parse_sinsn(&local_78,&status->status,&local_7c);
  peVar8->sinsn = peVar11;
  peVar6->subinsnsnum = (int)lVar12 + 1;
  peVar6->subinsns[lVar12] = peVar8;
  if (local_7c != local_78.atomsnum) {
    abort();
  }
  status->insn = peVar6;
  if (0 < local_78.atomsnum) {
    lVar12 = 0;
    do {
      free(local_78.atoms[lVar12]);
      lVar12 = lVar12 + 1;
    } while (lVar12 < local_78.atomsnum);
  }
  free(local_78.atoms);
  return status;
}

Assistant:

struct dis_res *do_dis(struct decoctx *deco, uint32_t cur) {
	struct disctx c = { 0 };
	struct disctx *ctx = &c;
	struct dis_res *res = calloc(sizeof *res, 1);
	int i;
	int stride = ed_getcstride(deco->isa, deco->varinfo);
	for (i = 0; i < MAXOPLEN*8 && cur + i/stride < deco->codesz; i++) {
		res->a[i/8] |= (ull)deco->code[cur*stride + i] << (i&7)*8;
	}
	ctx->isa = deco->isa;
	ctx->varinfo = deco->varinfo;
	if (deco->isa->tsched && (cur % deco->isa->schedpos) == 0)
		atomtab_d (ctx, res->a, res->m, deco->isa->tsched);
	else
		atomtab_d (ctx, res->a, res->m, deco->isa->troot);
	res->oplen = ctx->oplen;
	if (res->oplen + cur > deco->codesz)
		res->status |= DIS_STATUS_EOF;
	if (res->oplen == 0) {
		res->status |= DIS_STATUS_UNK_FORM;
		res->oplen = ctx->isa->opunit;
	}
	res->endmark = ctx->endmark;
	/* XXX unused status */
	res->insn = dis_parse_insn(ctx, &res->status);

	for (i = 0; i < ctx->atomsnum; ++i)
		free(ctx->atoms[i]);
	free(ctx->atoms);

	return res;
}